

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O3

DdApaNumber
cuddApaCountMintermAux(DdNode *node,int digits,DdApaNumber max,DdApaNumber min,st__table *table)

{
  DdHalfWord DVar1;
  DdNode *pDVar2;
  int iVar3;
  DdApaNumber __ptr;
  uint *__ptr_00;
  ulong uVar4;
  ulong uVar5;
  uint *local_50;
  DdNode *local_48;
  DdNode *local_40;
  st__table *local_38;
  
  if (node->index == 0x7fffffff) {
    if (zero == node) {
      max = min;
    }
    if (background == node) {
      return min;
    }
    return max;
  }
  if ((1 < node->ref) && (iVar3 = st__lookup(table,(char *)node,(char **)&local_50), iVar3 != 0)) {
    return local_50;
  }
  local_48 = (node->type).kids.T;
  pDVar2 = (node->type).kids.E;
  __ptr = cuddApaCountMintermAux(local_48,digits,max,min,table);
  if (__ptr == (DdApaNumber)0x0) {
    return (DdApaNumber)0x0;
  }
  local_40 = (DdNode *)((ulong)pDVar2 & 0xfffffffffffffffe);
  local_38 = table;
  __ptr_00 = cuddApaCountMintermAux(local_40,digits,max,min,table);
  if (__ptr_00 == (DdApaNumber)0x0) {
    DVar1 = local_48->ref;
    __ptr_00 = __ptr;
  }
  else {
    local_50 = (uint *)malloc((long)digits << 2);
    if (local_50 != (uint *)0x0) {
      if (((ulong)pDVar2 & 1) == 0) {
        if (0 < digits) {
          uVar4 = (ulong)(uint)digits + 1;
          do {
            local_50[uVar4 - 2] = __ptr_00[uVar4 - 2] + __ptr[uVar4 - 2];
            uVar4 = uVar4 - 1;
          } while (1 < uVar4);
LAB_007c5c02:
          if (1 < digits) {
            uVar4 = (ulong)(uint)digits + 1;
            do {
              local_50[uVar4 - 2] = local_50[uVar4 - 2] >> 1 | local_50[uVar4 - 3] << 0x1f;
              uVar4 = uVar4 - 1;
            } while (2 < uVar4);
          }
        }
      }
      else if (0 < digits) {
        uVar4 = (ulong)(uint)digits + 1;
        uVar5 = 0x100000000;
        do {
          uVar5 = ((ulong)max[uVar4 - 2] + (uVar5 >> 0x20) + 0xffffffff) -
                  (ulong)__ptr_00[uVar4 - 2];
          local_50[uVar4 - 2] = (uint)uVar5;
          uVar4 = uVar4 - 1;
        } while (1 < uVar4);
        uVar4 = (ulong)(uint)digits + 1;
        do {
          local_50[uVar4 - 2] = local_50[uVar4 - 2] + __ptr[uVar4 - 2];
          uVar4 = uVar4 - 1;
        } while (1 < uVar4);
        goto LAB_007c5c02;
      }
      *local_50 = *local_50 >> 1;
      if (local_48->ref == 1) {
        free(__ptr);
      }
      if (local_40->ref == 1) {
        free(__ptr_00);
      }
      if (node->ref < 2) {
        return local_50;
      }
      iVar3 = st__insert(local_38,(char *)node,(char *)local_50);
      if (iVar3 != -10000) {
        return local_50;
      }
      __ptr_00 = local_50;
      if (local_50 == (uint *)0x0) {
        return (DdApaNumber)0x0;
      }
      goto LAB_007c5c7e;
    }
    if (local_48->ref == 1) {
      free(__ptr);
    }
    DVar1 = local_40->ref;
  }
  if (DVar1 != 1) {
    return (DdApaNumber)0x0;
  }
LAB_007c5c7e:
  free(__ptr_00);
  return (DdApaNumber)0x0;
}

Assistant:

static DdApaNumber
cuddApaCountMintermAux(
  DdNode * node,
  int  digits,
  DdApaNumber  max,
  DdApaNumber  min,
  st__table * table)
{
    DdNode      *Nt, *Ne;
    DdApaNumber mint, mint1, mint2;
    DdApaDigit  carryout;

    if (cuddIsConstant(node)) {
        if (node == background || node == zero) {
            return(min);
        } else {
            return(max);
        }
    }
    if (node->ref > 1 && st__lookup(table, (const char *)node, (char **)&mint)) {
        return(mint);
    }

    Nt = cuddT(node); Ne = cuddE(node);

    mint1 = cuddApaCountMintermAux(Nt,  digits, max, min, table);
    if (mint1 == NULL) return(NULL);
    mint2 = cuddApaCountMintermAux(Cudd_Regular(Ne), digits, max, min, table);
    if (mint2 == NULL) {
        if (Nt->ref == 1) ABC_FREE(mint1);
        return(NULL);
    }
    mint = Cudd_NewApaNumber(digits);
    if (mint == NULL) {
        if (Nt->ref == 1) ABC_FREE(mint1);
        if (Cudd_Regular(Ne)->ref == 1) ABC_FREE(mint2);
        return(NULL);
    }
    if (Cudd_IsComplement(Ne)) {
        (void) Cudd_ApaSubtract(digits,max,mint2,mint);
        carryout = Cudd_ApaAdd(digits,mint1,mint,mint);
    } else {
        carryout = Cudd_ApaAdd(digits,mint1,mint2,mint);
    }
    Cudd_ApaShiftRight(digits,carryout,mint,mint);
    /* If the refernce count of a child is 1, its minterm count
    ** hasn't been stored in table.  Therefore, it must be explicitly
    ** freed here. */
    if (Nt->ref == 1) ABC_FREE(mint1);
    if (Cudd_Regular(Ne)->ref == 1) ABC_FREE(mint2);

    if (node->ref > 1) {
        if ( st__insert(table, (char *)node, (char *)mint) == st__OUT_OF_MEM) {
            ABC_FREE(mint);
            return(NULL);
        }
    }
    return(mint);

}